

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O3

string_type * __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_literal<char_const*>
          (string_type *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *this_00;
  size_type sVar1;
  bool bVar2;
  compiler_token_type cVar3;
  char *pcVar4;
  escape_value eVar5;
  char *tmp;
  char *local_68;
  regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
  *local_50;
  quant_spec local_48;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  local_60 = this;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  pcVar4 = *begin;
  local_68 = pcVar4 + 1;
  *begin = local_68;
  if (local_68 != end) {
    local_50 = local_60 + 8;
    this_00 = (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
               *)(local_60 + 0x10);
    while( true ) {
      local_48.greedy_ = false;
      local_48.min_ = 0;
      local_48.max_ = 0;
      local_48.hidden_mark_count_ = (size_t *)local_50;
      bVar2 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_quant_spec<char_const*>(this_00,&local_68,end,&local_48);
      if (bVar2) break;
      cVar3 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_token<char_const*>(this_00,&local_68,end);
      if (cVar3 == token_literal) {
        local_68 = local_68 + 1;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      }
      else {
        if (cVar3 != token_escape) {
          return __return_storage_ptr__;
        }
        eVar5 = parse_escape<char_const*>(local_60,&local_68,end);
        if (eVar5._8_8_ >> 0x20 != 0) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      }
      pcVar4 = *begin;
      *begin = local_68;
      if (local_68 == end) {
        return __return_storage_ptr__;
      }
    }
    sVar1 = __return_storage_ptr__->_M_string_length;
    if (sVar1 != 1) {
      *begin = pcVar4;
      std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,sVar1 - 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string_type parse_literal(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        BOOST_ASSERT(token_literal == this->traits_.get_token(begin, end));
        escape_value esc = { 0, 0, 0, detail::escape_char };
        string_type literal(1, *begin);

        for(FwdIter prev = begin, tmp = ++begin; begin != end; prev = begin, begin = tmp)
        {
            detail::quant_spec spec = { 0, 0, false, &this->hidden_mark_count_ };
            if(this->traits_.get_quant_spec(tmp, end, spec))
            {
                if(literal.size() != 1)
                {
                    begin = prev;
                    literal.erase(boost::prior(literal.end()));
                }
                return literal;
            }
            else switch(this->traits_.get_token(tmp, end))
            {
            case token_escape:
                esc = this->parse_escape(tmp, end);
                if(detail::escape_char != esc.type_) return literal;
                literal.insert(literal.end(), esc.ch_);
                break;
            case token_literal:
                literal.insert(literal.end(), *tmp++);
                break;
            default:
                return literal;
            }
        }

        return literal;
    }